

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
RegisterSubprocessTestSetWithSingle::RegisterSubprocessTestSetWithSingle
          (RegisterSubprocessTestSetWithSingle *this)

{
  RegisterSubprocessTestSetWithSingle *this_local;
  
  RegisterTest(SubprocessTestSetWithSingle::Create,"SubprocessTest.SetWithSingle");
  return;
}

Assistant:

TEST_F(SubprocessTest, SetWithSingle) {
  Subprocess* subproc = subprocs_.Add(kSimpleCommand);
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_NE("", subproc->GetOutput());

  ASSERT_EQ(1u, subprocs_.finished_.size());
}